

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O3

void __thiscall cmExtraCodeLiteGenerator::Generate(cmExtraCodeLiteGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  cmGlobalGenerator *pcVar7;
  long *plVar8;
  size_type *psVar9;
  long *plVar10;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string workspaceProjectName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string workspaceOutputDir;
  string workspaceFileName;
  string workspaceSourcePath;
  string filename;
  string projectName;
  string lprjdebug;
  cmGeneratedFileStream fout;
  string local_408;
  char *local_3e8;
  long local_3e0;
  char local_3d8;
  undefined7 uStack_3d7;
  long *local_3c8;
  long local_3c0;
  long local_3b8;
  long lStack_3b0;
  string local_3a8;
  undefined1 *local_388;
  char *local_380;
  undefined1 local_378;
  undefined7 uStack_377;
  char *local_368;
  undefined8 local_360;
  char local_358;
  undefined7 uStack_357;
  undefined1 *local_348;
  char *local_340;
  undefined1 local_338;
  undefined7 uStack_337;
  long *local_328;
  long local_320;
  long local_318;
  long lStack_310;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  string local_2e8;
  char *local_2c8;
  long local_2c0;
  char local_2b8;
  undefined7 uStack_2b7;
  string *local_2a8;
  string *local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  cmGeneratedFileStream local_278;
  
  local_3e8 = &local_3d8;
  local_3e0 = 0;
  local_3d8 = '\0';
  local_388 = &local_378;
  local_380 = (char *)0x0;
  local_378 = 0;
  local_368 = &local_358;
  local_360 = 0;
  local_358 = '\0';
  local_348 = &local_338;
  local_340 = (char *)0x0;
  local_338 = 0;
  local_2c8 = &local_2b8;
  local_2c0 = 0;
  local_2b8 = '\0';
  cmGeneratedFileStream::cmGeneratedFileStream(&local_278);
  pcVar7 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  p_Var6 = (pcVar7->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var6 != &(pcVar7->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
    local_2a0 = (string *)&this->ConfigName;
    paVar1 = &local_408.field_2;
    local_2a8 = &this->WorkspacePath;
    do {
      GetConfigurationName_abi_cxx11_
                (&local_408,(cmExtraCodeLiteGenerator *)in_RSI,
                 *(cmMakefile **)(**(long **)(p_Var6 + 2) + 0x28));
      std::__cxx11::string::operator=(local_2a0,(string *)&local_408);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != paVar1) {
        operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = cmLocalGenerator::GetCurrentBinaryDirectory
                         ((cmLocalGenerator *)**(undefined8 **)(p_Var6 + 2));
      in_RSI = cmLocalGenerator::GetBinaryDirectory
                         ((cmLocalGenerator *)**(undefined8 **)(p_Var6 + 2));
      iVar2 = strcmp(pcVar3,in_RSI);
      if (iVar2 == 0) {
        pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory
                           ((cmLocalGenerator *)**(undefined8 **)(p_Var6 + 2));
        pcVar3 = local_380;
        strlen(pcVar4);
        std::__cxx11::string::_M_replace((ulong)&local_388,0,pcVar3,(ulong)pcVar4);
        cmLocalGenerator::GetProjectName_abi_cxx11_
                  (&local_408,(cmLocalGenerator *)**(undefined8 **)(p_Var6 + 2));
        std::__cxx11::string::operator=((string *)&local_3e8,(string *)&local_408);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != paVar1) {
          operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
        }
        pcVar4 = cmLocalGenerator::GetSourceDirectory
                           ((cmLocalGenerator *)**(undefined8 **)(p_Var6 + 2));
        pcVar3 = local_340;
        strlen(pcVar4);
        std::__cxx11::string::_M_replace((ulong)&local_348,0,pcVar3,(ulong)pcVar4);
        local_408._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_408,local_388,local_380 + (long)local_388);
        std::__cxx11::string::append((char *)&local_408);
        std::__cxx11::string::operator=((string *)&local_368,(string *)&local_408);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != paVar1) {
          operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
        }
        local_408._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_408,local_3e8,local_3e8 + local_3e0);
        std::__cxx11::string::append((char *)&local_408);
        std::__cxx11::string::_M_append((char *)&local_368,(ulong)local_408._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != paVar1) {
          operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
        }
        pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory
                           ((cmLocalGenerator *)**(undefined8 **)(p_Var6 + 2));
        pcVar3 = (char *)(this->WorkspacePath)._M_string_length;
        strlen(pcVar4);
        std::__cxx11::string::_M_replace((ulong)local_2a8,0,pcVar3,(ulong)pcVar4);
        cmGeneratedFileStream::Open(&local_278,local_368,false,false);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_278,
                   "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n<CodeLite_Workspace Name=\"",0x41);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_278,local_3e8,local_3e0);
        in_RSI = "\" >\n";
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" >\n",4);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      pcVar7 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    } while ((_Rb_tree_header *)p_Var6 != &(pcVar7->ProjectMap)._M_t._M_impl.super__Rb_tree_header);
    p_Var6 = (pcVar7->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  if ((_Rb_tree_header *)p_Var6 != &(pcVar7->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
    paVar1 = &local_3a8.field_2;
    do {
      pcVar3 = cmLocalGenerator::GetCurrentBinaryDirectory
                         ((cmLocalGenerator *)**(undefined8 **)(p_Var6 + 2));
      std::__cxx11::string::string((string *)&local_408,pcVar3,(allocator *)&local_2e8);
      cmLocalGenerator::GetProjectName_abi_cxx11_
                (&local_2e8,(cmLocalGenerator *)**(undefined8 **)(p_Var6 + 2));
      local_3c8 = &local_3b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3c8,local_408._M_dataplus._M_p,
                 local_408._M_dataplus._M_p + local_408._M_string_length);
      std::__cxx11::string::append((char *)&local_3c8);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_3c8,(ulong)local_2e8._M_dataplus._M_p);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_3a8.field_2._M_allocated_capacity = *psVar9;
        local_3a8.field_2._8_8_ = plVar8[3];
        local_3a8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_3a8.field_2._M_allocated_capacity = *psVar9;
        local_3a8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_3a8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_3a8);
      local_328 = &local_318;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_318 = *plVar10;
        lStack_310 = plVar8[3];
      }
      else {
        local_318 = *plVar10;
        local_328 = (long *)*plVar8;
      }
      local_320 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      if (local_3c8 != &local_3b8) {
        operator_delete(local_3c8,local_3b8 + 1);
      }
      cmSystemTools::RelativePath_abi_cxx11_
                (&local_3a8,(cmSystemTools *)(this->WorkspacePath)._M_dataplus._M_p,
                 (char *)local_328,(char *)plVar10);
      std::__cxx11::string::operator=((string *)&local_328,(string *)&local_3a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      CreateProjectFile(this,(vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                             (p_Var6 + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_278,"  <Project Name=\"",0x11);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_278,local_2e8._M_dataplus._M_p,
                          local_2e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" Path=\"",8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_328,local_320);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" Active=\"No\"/>\n",0x10);
      std::operator+(&local_298,"<Project Name=\"",&local_2e8);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_308 = &local_2f8;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_2f8 = *plVar10;
        lStack_2f0 = plVar8[3];
      }
      else {
        local_2f8 = *plVar10;
        local_308 = (long *)*plVar8;
      }
      local_300 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_308,(ulong)(this->ConfigName)._M_dataplus._M_p);
      local_3c8 = &local_3b8;
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_3b8 = *plVar10;
        lStack_3b0 = plVar8[3];
      }
      else {
        local_3b8 = *plVar10;
        local_3c8 = (long *)*plVar8;
      }
      local_3c0 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_3c8);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_3a8.field_2._M_allocated_capacity = *psVar9;
        local_3a8.field_2._8_8_ = plVar8[3];
        local_3a8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_3a8.field_2._M_allocated_capacity = *psVar9;
        local_3a8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_3a8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_3a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      if (local_3c8 != &local_3b8) {
        operator_delete(local_3c8,local_3b8 + 1);
      }
      if (local_308 != &local_2f8) {
        operator_delete(local_308,local_2f8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_328 != &local_318) {
        operator_delete(local_328,local_318 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 !=
             &(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->ProjectMap)._M_t.
              _M_impl.super__Rb_tree_header);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_278,"  <BuildMatrix>\n    <WorkspaceConfiguration Name=\"",0x32);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_278,(this->ConfigName)._M_dataplus._M_p,
                      (this->ConfigName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" Selected=\"yes\">\n      ",0x18);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_2c8,local_2c0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"    </WorkspaceConfiguration>\n  </BuildMatrix>\n</CodeLite_Workspace>\n",0x45)
  ;
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,CONCAT71(uStack_2b7,local_2b8) + 1);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348,CONCAT71(uStack_337,local_338) + 1);
  }
  if (local_368 != &local_358) {
    operator_delete(local_368,CONCAT71(uStack_357,local_358) + 1);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388,CONCAT71(uStack_377,local_378) + 1);
  }
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8,CONCAT71(uStack_3d7,local_3d8) + 1);
  }
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::Generate()
{
  // Hold root tree information for creating the workspace
  std::string workspaceProjectName;
  std::string workspaceOutputDir;
  std::string workspaceFileName;
  std::string workspaceSourcePath;
  std::string lprjdebug;

  cmGeneratedFileStream fout;

  // loop projects and locate the root project.
  // and extract the information for creating the worspace
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
       it!= this->GlobalGenerator->GetProjectMap().end();
       ++it)
    {
    const cmMakefile* mf =it->second[0]->GetMakefile();
    this->ConfigName = GetConfigurationName( mf );

    if (strcmp(it->second[0]->GetCurrentBinaryDirectory(),
               it->second[0]->GetBinaryDirectory()) == 0)
      {
      workspaceOutputDir   = it->second[0]->GetCurrentBinaryDirectory();
      workspaceProjectName = it->second[0]->GetProjectName();
      workspaceSourcePath  = it->second[0]->GetSourceDirectory();
      workspaceFileName    = workspaceOutputDir+"/";
      workspaceFileName   += workspaceProjectName + ".workspace";
      this->WorkspacePath = it->second[0]->GetCurrentBinaryDirectory();;

      fout.Open(workspaceFileName.c_str(), false, false);
      fout << "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n"
           "<CodeLite_Workspace Name=\"" << workspaceProjectName << "\" >\n";
      }
    }

  // for each sub project in the workspace create a codelite project
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
       it!= this->GlobalGenerator->GetProjectMap().end();
       ++it)
    {
    // retrive project information
    std::string outputDir   = it->second[0]->GetCurrentBinaryDirectory();
    std::string projectName = it->second[0]->GetProjectName();
    std::string filename    = outputDir + "/" + projectName + ".project";

    // Make the project file relative to the workspace
    filename = cmSystemTools::RelativePath(this->WorkspacePath.c_str(),
                                          filename.c_str());

    // create a project file
    this->CreateProjectFile(it->second);
    fout << "  <Project Name=\"" << projectName << "\" Path=\""
    << filename << "\" Active=\"No\"/>\n";
    lprjdebug += "<Project Name=\"" + projectName
              + "\" ConfigName=\"" + this->ConfigName + "\"/>\n";
    }

  fout << "  <BuildMatrix>\n"
       "    <WorkspaceConfiguration Name=\""
       << this->ConfigName << "\" Selected=\"yes\">\n"
       "      " << lprjdebug << ""
       "    </WorkspaceConfiguration>\n"
       "  </BuildMatrix>\n"
       "</CodeLite_Workspace>\n";
}